

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O3

UINT8 device_start_k051649(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  undefined1 auVar1 [16];
  UINT8 UVar2;
  DEV_DATA DVar3;
  void *pvVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int *piVar9;
  int iVar10;
  k051649_state *info;
  undefined1 auVar11 [16];
  long lVar12;
  
  DVar3.chipInf = calloc(1,0x108);
  if ((DEV_DATA *)DVar3.chipInf == (DEV_DATA *)0x0) {
    UVar2 = 0xff;
  }
  else {
    *(UINT8 *)((long)DVar3.chipInf + 0x102) = cfg->flags;
    uVar8 = cfg->clock;
    *(uint *)((long)DVar3.chipInf + 0xe4) = uVar8;
    uVar8 = uVar8 >> 4;
    *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 0xe8))->chipInf = uVar8;
    pvVar4 = malloc(0x2800);
    ((DEV_DATA *)((long)DVar3.chipInf + 0xf0))->chipInf = pvVar4;
    piVar5 = (int *)((long)pvVar4 + 0x1400);
    ((DEV_DATA *)((long)DVar3.chipInf + 0xf8))->chipInf = piVar5;
    uVar7 = 0;
    piVar9 = piVar5;
    do {
      iVar10 = (int)((uVar7 & 0xffffffff) / 5);
      *piVar5 = iVar10;
      *piVar9 = -iVar10;
      auVar1 = _DAT_001733d0;
      uVar7 = uVar7 + 0x80;
      piVar9 = piVar9 + -1;
      piVar5 = piVar5 + 1;
    } while (uVar7 != 0x28000);
    lVar6 = 0x5e;
    auVar11 = _DAT_001733c0;
    do {
      if (SUB164(auVar11 ^ auVar1,4) == -0x80000000 && SUB164(auVar11 ^ auVar1,0) < -0x7ffffffb) {
        *(undefined1 *)((long)DVar3.chipInf + lVar6 + -0x2c) = 0;
        *(undefined1 *)((long)DVar3.chipInf + lVar6) = 0;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar6 = lVar6 + 0x58;
    } while (lVar6 != 0x166);
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar8;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_k051649(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k051649_state *info;

	info = (k051649_state *)calloc(1, sizeof(k051649_state));
	if (info == NULL)
		return 0xFF;

	// get stream channels
	info->mode_plus = cfg->flags;
	info->mclock = cfg->clock;
	info->rate = info->mclock / 16;

	// build the mixer table
	make_mixer_table(info, 5);
	
	k051649_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);
	return 0x00;
}